

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NetPortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetPortHeaderSyntax,slang::syntax::NetPortHeaderSyntax_const&>
          (BumpAllocator *this,NetPortHeaderSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  DataTypeSyntax *pDVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  SyntaxKind SVar13;
  undefined4 uVar14;
  NetPortHeaderSyntax *pNVar15;
  
  pNVar15 = (NetPortHeaderSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NetPortHeaderSyntax *)this->endPtr < pNVar15 + 1) {
    pNVar15 = (NetPortHeaderSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pNVar15 + 1);
  }
  SVar13 = (args->super_PortHeaderSyntax).super_SyntaxNode.kind;
  uVar14 = *(undefined4 *)&(args->super_PortHeaderSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortHeaderSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_PortHeaderSyntax).super_SyntaxNode.previewNode;
  TVar9 = (args->direction).kind;
  uVar10 = (args->direction).field_0x2;
  NVar11.raw = (args->direction).numFlags.raw;
  uVar12 = (args->direction).rawLen;
  pIVar3 = (args->direction).info;
  TVar5 = (args->netType).kind;
  uVar6 = (args->netType).field_0x2;
  NVar7.raw = (args->netType).numFlags.raw;
  uVar8 = (args->netType).rawLen;
  pDVar4 = (args->dataType).ptr;
  (pNVar15->netType).info = (args->netType).info;
  (pNVar15->dataType).ptr = pDVar4;
  (pNVar15->direction).info = pIVar3;
  (pNVar15->netType).kind = TVar5;
  (pNVar15->netType).field_0x2 = uVar6;
  (pNVar15->netType).numFlags = (NumericTokenFlags)NVar7.raw;
  (pNVar15->netType).rawLen = uVar8;
  (pNVar15->super_PortHeaderSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pNVar15->direction).kind = TVar9;
  (pNVar15->direction).field_0x2 = uVar10;
  (pNVar15->direction).numFlags = (NumericTokenFlags)NVar11.raw;
  (pNVar15->direction).rawLen = uVar12;
  (pNVar15->super_PortHeaderSyntax).super_SyntaxNode.kind = SVar13;
  *(undefined4 *)&(pNVar15->super_PortHeaderSyntax).super_SyntaxNode.field_0x4 = uVar14;
  (pNVar15->super_PortHeaderSyntax).super_SyntaxNode.parent = pSVar1;
  return pNVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }